

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O1

int LzmaDec_DecodeReal2(CLzmaDec *p,SizeT limit,Byte *bufLimit)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  CLzmaProb *pCVar7;
  Byte *pBVar8;
  SizeT SVar9;
  short sVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  char cVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  CLzmaProb *pCVar18;
  Byte *pBVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  ushort *puVar29;
  SizeT SVar30;
  uint uVar31;
  UInt32 UVar32;
  UInt32 UVar33;
  byte *pbVar34;
  uint uVar35;
  SizeT SVar36;
  bool bVar37;
  uint local_b4;
  UInt32 local_b0;
  UInt32 local_ac;
  uint local_a4;
  UInt32 local_94;
  
  uVar6 = p->checkDicSize;
  if ((uVar6 == 0) &&
     (uVar23 = (ulong)((p->prop).dicSize - p->processedPos), uVar23 < limit - p->dicPos)) {
    limit = p->dicPos + uVar23;
  }
  pCVar7 = p->probs_1664;
  UVar33 = p->state;
  local_b4 = p->reps[0];
  local_ac = p->reps[1];
  local_b0 = p->reps[2];
  bVar1 = (p->prop).pb;
  bVar2 = (p->prop).lp;
  bVar3 = (p->prop).lc;
  local_94 = p->reps[3];
  pBVar8 = p->dic;
  SVar9 = p->dicBufSize;
  SVar36 = p->dicPos;
  local_a4 = p->processedPos;
  pbVar34 = p->buf;
  uVar25 = p->range;
  uVar12 = p->code;
  uVar31 = 0;
  do {
    UVar32 = local_94;
    uVar22 = local_b4;
    if (uVar25 < 0x1000000) {
      uVar25 = uVar25 << 8;
      bVar20 = *pbVar34;
      pbVar34 = pbVar34 + 1;
      uVar12 = (uint)bVar20 | uVar12 << 8;
    }
    uVar15 = (local_a4 & ~(-1 << (bVar1 & 0x1f))) * 0x10;
    uVar23 = (ulong)(UVar33 + uVar15);
    uVar5 = pCVar7[uVar23 - 0x100];
    uVar26 = (uVar25 >> 0xb) * (uint)uVar5;
    uVar21 = uVar12 - uVar26;
    if (uVar12 < uVar26) {
      pCVar7[uVar23 - 0x100] = (short)(0x800 - uVar5 >> 5) + uVar5;
      pCVar18 = pCVar7 + 0x140;
      if (local_a4 != 0 || uVar6 != 0) {
        uVar23 = SVar36;
        if (SVar36 == 0) {
          uVar23 = SVar9;
        }
        pCVar18 = pCVar7 + 0x140 +
                  ((((uint)pBVar8[uVar23 - 1] | local_a4 << 8) &
                   (0x100 << (bVar2 & 0x1f)) - (0x100U >> (bVar3 & 0x1f))) << (bVar3 & 0x1f)) * 3;
      }
      if (UVar33 < 7) {
        bVar37 = UVar33 < 3;
        UVar33 = UVar33 - 3;
        if (bVar37) {
          UVar33 = 0;
        }
        if (uVar26 < 0x1000000) {
          uVar26 = uVar26 * 0x100;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar12 = (uint)bVar20 | uVar12 << 8;
        }
        uVar5 = pCVar18[1];
        uVar22 = (uVar26 >> 0xb) * (uint)uVar5;
        uVar25 = uVar12 - uVar22;
        if (uVar12 < uVar22) {
          sVar10 = (short)(0x800 - uVar5 >> 5);
          uVar21 = 2;
          uVar25 = uVar12;
        }
        else {
          uVar22 = uVar26 - uVar22;
          sVar10 = -(uVar5 >> 5);
          uVar21 = 3;
        }
        pCVar18[1] = sVar10 + uVar5;
        if (uVar22 < 0x1000000) {
          uVar22 = uVar22 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar25 = (uint)bVar20 | uVar25 << 8;
        }
        uVar5 = pCVar18[uVar21];
        uVar26 = (uVar22 >> 0xb) * (uint)uVar5;
        uVar12 = uVar21 * 2;
        uVar15 = uVar25 - uVar26;
        if (uVar25 < uVar26) {
          pCVar18[uVar21] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar15 = uVar25;
        }
        else {
          uVar26 = uVar22 - uVar26;
          pCVar18[uVar21] = uVar5 - (uVar5 >> 5);
          uVar12 = uVar12 | 1;
        }
        uVar5 = pCVar18[uVar12];
        if (uVar26 < 0x1000000) {
          uVar26 = uVar26 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar15 = (uint)bVar20 | uVar15 << 8;
        }
        uVar21 = (uVar26 >> 0xb) * (uint)uVar5;
        uVar25 = uVar12 * 2;
        uVar22 = uVar15 - uVar21;
        if (uVar15 < uVar21) {
          pCVar18[uVar12] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar22 = uVar15;
        }
        else {
          uVar21 = uVar26 - uVar21;
          pCVar18[uVar12] = uVar5 - (uVar5 >> 5);
          uVar25 = uVar25 | 1;
        }
        uVar5 = pCVar18[uVar25];
        if (uVar21 < 0x1000000) {
          uVar21 = uVar21 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar22 = (uint)bVar20 | uVar22 << 8;
        }
        uVar26 = (uVar21 >> 0xb) * (uint)uVar5;
        uVar12 = uVar25 * 2;
        uVar15 = uVar22 - uVar26;
        if (uVar22 < uVar26) {
          pCVar18[uVar25] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar15 = uVar22;
        }
        else {
          uVar26 = uVar21 - uVar26;
          pCVar18[uVar25] = uVar5 - (uVar5 >> 5);
          uVar12 = uVar12 | 1;
        }
        uVar5 = pCVar18[uVar12];
        if (uVar26 < 0x1000000) {
          uVar26 = uVar26 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar15 = (uint)bVar20 | uVar15 << 8;
        }
        uVar21 = (uVar26 >> 0xb) * (uint)uVar5;
        uVar25 = uVar12 * 2;
        uVar22 = uVar15 - uVar21;
        if (uVar15 < uVar21) {
          pCVar18[uVar12] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar22 = uVar15;
        }
        else {
          uVar21 = uVar26 - uVar21;
          pCVar18[uVar12] = uVar5 - (uVar5 >> 5);
          uVar25 = uVar25 | 1;
        }
        uVar5 = pCVar18[uVar25];
        if (uVar21 < 0x1000000) {
          uVar21 = uVar21 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar22 = (uint)bVar20 | uVar22 << 8;
        }
        uVar26 = (uVar21 >> 0xb) * (uint)uVar5;
        uVar12 = uVar25 * 2;
        uVar15 = uVar22 - uVar26;
        if (uVar22 < uVar26) {
          pCVar18[uVar25] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar15 = uVar22;
        }
        else {
          uVar26 = uVar21 - uVar26;
          pCVar18[uVar25] = uVar5 - (uVar5 >> 5);
          uVar12 = uVar12 | 1;
        }
        uVar5 = pCVar18[uVar12];
        if (uVar26 < 0x1000000) {
          uVar26 = uVar26 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar15 = (uint)bVar20 | uVar15 << 8;
        }
        uVar27 = (uVar26 >> 0xb) * (uint)uVar5;
        uVar22 = uVar12 * 2;
        uVar21 = uVar15 - uVar27;
        if (uVar15 < uVar27) {
          pCVar18[uVar12] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar21 = uVar15;
        }
        else {
          uVar27 = uVar26 - uVar27;
          pCVar18[uVar12] = uVar5 - (uVar5 >> 5);
          uVar22 = uVar22 | 1;
        }
        uVar5 = pCVar18[uVar22];
        if (uVar27 < 0x1000000) {
          uVar27 = uVar27 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar21 = (uint)bVar20 | uVar21 << 8;
        }
        uVar25 = (uVar27 >> 0xb) * (uint)uVar5;
        bVar20 = (char)uVar22 * '\x02';
        uVar12 = uVar21 - uVar25;
        if (uVar21 < uVar25) {
          pCVar18[uVar22] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar12 = uVar21;
        }
        else {
          uVar25 = uVar27 - uVar25;
          pCVar18[uVar22] = uVar5 - (uVar5 >> 5);
          bVar20 = bVar20 | 1;
        }
      }
      else {
        SVar30 = 0;
        if (SVar36 < local_b4) {
          SVar30 = SVar9;
        }
        if (uVar26 < 0x1000000) {
          uVar26 = uVar26 * 0x100;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar12 = (uint)bVar20 | uVar12 << 8;
        }
        bVar20 = pBVar8[SVar30 + (SVar36 - local_b4)];
        uVar21 = (uint)bVar20;
        uVar15 = (uint)bVar20 + (uint)bVar20 & 0x100;
        uVar5 = pCVar18[(ulong)uVar15 + 0x101];
        uVar22 = (uVar26 >> 0xb) * (uint)uVar5;
        uVar25 = uVar12 - uVar22;
        if (uVar12 < uVar22) {
          pCVar18[(ulong)uVar15 + 0x101] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar15 = uVar15 ^ 0x100;
          iVar17 = 2;
          uVar25 = uVar12;
        }
        else {
          uVar22 = uVar26 - uVar22;
          pCVar18[(ulong)uVar15 + 0x101] = uVar5 - (uVar5 >> 5);
          iVar17 = 3;
        }
        uVar12 = (uint)bVar20 * 4 & uVar15;
        uVar26 = uVar15 + iVar17 + uVar12;
        uVar5 = pCVar18[uVar26];
        if (uVar22 < 0x1000000) {
          uVar22 = uVar22 << 8;
          bVar4 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar25 = (uint)bVar4 | uVar25 << 8;
        }
        uVar35 = (uVar22 >> 0xb) * (uint)uVar5;
        uVar27 = iVar17 * 2;
        uVar13 = uVar25 - uVar35;
        if (uVar25 < uVar35) {
          pCVar18[uVar26] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar12 = uVar12 ^ uVar15;
          uVar13 = uVar25;
        }
        else {
          uVar35 = uVar22 - uVar35;
          pCVar18[uVar26] = uVar5 - (uVar5 >> 5);
          uVar27 = uVar27 | 1;
        }
        uVar25 = (uint)bVar20 * 8 & uVar12;
        uVar22 = uVar12 + uVar27 + uVar25;
        uVar5 = pCVar18[uVar22];
        if (uVar35 < 0x1000000) {
          uVar35 = uVar35 << 8;
          bVar4 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar13 = (uint)bVar4 | uVar13 << 8;
        }
        uVar26 = (uVar35 >> 0xb) * (uint)uVar5;
        uVar27 = uVar27 * 2;
        uVar15 = uVar13 - uVar26;
        if (uVar13 < uVar26) {
          pCVar18[uVar22] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar25 = uVar25 ^ uVar12;
          uVar15 = uVar13;
        }
        else {
          uVar26 = uVar35 - uVar26;
          pCVar18[uVar22] = uVar5 - (uVar5 >> 5);
          uVar27 = uVar27 | 1;
        }
        uVar12 = uVar21 << 4 & uVar25;
        uVar22 = uVar25 + uVar27 + uVar12;
        uVar5 = pCVar18[uVar22];
        if (uVar26 < 0x1000000) {
          uVar26 = uVar26 << 8;
          bVar4 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar15 = (uint)bVar4 | uVar15 << 8;
        }
        uVar35 = (uVar26 >> 0xb) * (uint)uVar5;
        uVar27 = uVar27 * 2;
        uVar13 = uVar15 - uVar35;
        if (uVar15 < uVar35) {
          pCVar18[uVar22] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar12 = uVar12 ^ uVar25;
          uVar13 = uVar15;
        }
        else {
          uVar35 = uVar26 - uVar35;
          pCVar18[uVar22] = uVar5 - (uVar5 >> 5);
          uVar27 = uVar27 | 1;
        }
        uVar22 = (uint)bVar20 << 5 & uVar12;
        uVar25 = uVar12 + uVar27 + uVar22;
        uVar5 = pCVar18[uVar25];
        if (uVar35 < 0x1000000) {
          uVar35 = uVar35 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar13 = (uint)bVar20 | uVar13 << 8;
        }
        uVar26 = (uVar35 >> 0xb) * (uint)uVar5;
        uVar27 = uVar27 * 2;
        uVar15 = uVar13 - uVar26;
        if (uVar13 < uVar26) {
          pCVar18[uVar25] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar22 = uVar22 ^ uVar12;
          uVar15 = uVar13;
        }
        else {
          uVar26 = uVar35 - uVar26;
          pCVar18[uVar25] = uVar5 - (uVar5 >> 5);
          uVar27 = uVar27 | 1;
        }
        uVar12 = uVar21 << 6 & uVar22;
        uVar25 = uVar27 + uVar22 + uVar12;
        uVar5 = pCVar18[uVar25];
        if (uVar26 < 0x1000000) {
          uVar26 = uVar26 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar15 = (uint)bVar20 | uVar15 << 8;
        }
        uVar35 = (uVar26 >> 0xb) * (uint)uVar5;
        uVar27 = uVar27 * 2;
        uVar13 = uVar15 - uVar35;
        if (uVar15 < uVar35) {
          pCVar18[uVar25] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar12 = uVar12 ^ uVar22;
          uVar13 = uVar15;
        }
        else {
          uVar35 = uVar26 - uVar35;
          pCVar18[uVar25] = uVar5 - (uVar5 >> 5);
          uVar27 = uVar27 | 1;
        }
        uVar25 = uVar21 << 7 & uVar12;
        uVar22 = uVar12 + uVar27 + uVar25;
        uVar5 = pCVar18[uVar22];
        if (uVar35 < 0x1000000) {
          uVar35 = uVar35 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar13 = (uint)bVar20 | uVar13 << 8;
        }
        uVar26 = (uVar35 >> 0xb) * (uint)uVar5;
        uVar27 = uVar27 * 2;
        uVar15 = uVar13 - uVar26;
        if (uVar13 < uVar26) {
          pCVar18[uVar22] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar25 = uVar25 ^ uVar12;
          uVar15 = uVar13;
        }
        else {
          uVar26 = uVar35 - uVar26;
          pCVar18[uVar22] = uVar5 - (uVar5 >> 5);
          uVar27 = uVar27 | 1;
        }
        uVar22 = uVar25 + uVar27 + (uVar21 << 8 & uVar25);
        uVar5 = pCVar18[uVar22];
        if (uVar26 < 0x1000000) {
          uVar26 = uVar26 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar15 = (uint)bVar20 | uVar15 << 8;
        }
        UVar33 = (UVar33 + (uint)(UVar33 < 10) * 3) - 6;
        uVar25 = (uVar26 >> 0xb) * (uint)uVar5;
        bVar20 = (char)uVar27 * '\x02';
        uVar12 = uVar15 - uVar25;
        if (uVar15 < uVar25) {
          pCVar18[uVar22] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar12 = uVar15;
        }
        else {
          uVar25 = uVar26 - uVar25;
          pCVar18[uVar22] = uVar5 - (uVar5 >> 5);
          bVar20 = bVar20 | 1;
        }
      }
      local_a4 = local_a4 + 1;
      pBVar8[SVar36] = bVar20;
      SVar36 = SVar36 + 1;
      cVar14 = '\x03';
    }
    else {
      uVar25 = uVar25 - uVar26;
      pCVar7[uVar23 - 0x100] = uVar5 - (uVar5 >> 5);
      if (uVar25 < 0x1000000) {
        uVar25 = uVar25 * 0x100;
        bVar20 = *pbVar34;
        pbVar34 = pbVar34 + 1;
        uVar21 = uVar21 * 0x100 | (uint)bVar20;
      }
      uVar5 = pCVar7[(ulong)UVar33 + 0x10];
      uVar26 = (uVar25 >> 0xb) * (uint)uVar5;
      uVar12 = uVar21 - uVar26;
      if (uVar21 < uVar26) {
        pCVar7[(ulong)UVar33 + 0x10] = (short)(0x800 - uVar5 >> 5) + uVar5;
        UVar33 = UVar33 + 0xc;
        puVar29 = pCVar7 + -0x300;
      }
      else {
        uVar25 = uVar25 - uVar26;
        pCVar7[(ulong)UVar33 + 0x10] = uVar5 - (uVar5 >> 5);
        if (uVar25 < 0x1000000) {
          uVar25 = uVar25 * 0x100;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar12 = (uint)bVar20 | uVar12 * 0x100;
        }
        uVar5 = pCVar7[(ulong)UVar33 + 0x1c];
        uVar26 = (uVar25 >> 0xb) * (uint)uVar5;
        uVar21 = uVar12 - uVar26;
        if (uVar12 < uVar26) {
          pCVar7[(ulong)UVar33 + 0x1c] = (short)(0x800 - uVar5 >> 5) + uVar5;
          if (uVar26 < 0x1000000) {
            uVar26 = uVar26 * 0x100;
            bVar20 = *pbVar34;
            pbVar34 = pbVar34 + 1;
            uVar12 = (uint)bVar20 | uVar12 << 8;
          }
          uVar5 = pCVar7[uVar23 - 0x600];
          uVar25 = (uVar26 >> 0xb) * (uint)uVar5;
          uVar21 = uVar12 - uVar25;
          if (uVar12 < uVar25) {
            pCVar7[uVar23 - 0x600] = (short)(0x800 - uVar5 >> 5) + uVar5;
            SVar30 = 0;
            if (SVar36 < local_b4) {
              SVar30 = SVar9;
            }
            pBVar8[SVar36] = pBVar8[SVar30 + (SVar36 - local_b4)];
            SVar36 = SVar36 + 1;
            local_a4 = local_a4 + 1;
            UVar33 = (uint)(6 < UVar33) * 2 + 9;
            cVar14 = '\x03';
            goto LAB_00132c97;
          }
          uVar26 = uVar26 - uVar25;
          pCVar7[uVar23 - 0x600] = uVar5 - (uVar5 >> 5);
          uVar22 = local_ac;
        }
        else {
          uVar25 = uVar25 - uVar26;
          pCVar7[(ulong)UVar33 + 0x1c] = uVar5 - (uVar5 >> 5);
          if (uVar25 < 0x1000000) {
            uVar25 = uVar25 * 0x100;
            bVar20 = *pbVar34;
            pbVar34 = pbVar34 + 1;
            uVar21 = uVar21 * 0x100 | (uint)bVar20;
          }
          uVar5 = pCVar7[(ulong)UVar33 + 0x28];
          uVar26 = (uVar25 >> 0xb) * (uint)uVar5;
          uVar12 = uVar21 - uVar26;
          if (uVar21 < uVar26) {
            pCVar7[(ulong)UVar33 + 0x28] = (short)(0x800 - uVar5 >> 5) + uVar5;
            local_b4 = local_ac;
          }
          else {
            uVar25 = uVar25 - uVar26;
            pCVar7[(ulong)UVar33 + 0x28] = uVar5 - (uVar5 >> 5);
            if (uVar25 < 0x1000000) {
              uVar25 = uVar25 * 0x100;
              bVar20 = *pbVar34;
              pbVar34 = pbVar34 + 1;
              uVar12 = uVar12 * 0x100 | (uint)bVar20;
            }
            uVar5 = pCVar7[(ulong)UVar33 + 0x34];
            uVar26 = (uVar25 >> 0xb) * (uint)uVar5;
            uVar21 = uVar12 - uVar26;
            if (uVar12 < uVar26) {
              sVar10 = (short)(0x800 - uVar5 >> 5);
              uVar21 = uVar12;
              UVar32 = local_b0;
            }
            else {
              uVar26 = uVar25 - uVar26;
              sVar10 = -(uVar5 >> 5);
              local_94 = local_b0;
            }
            pCVar7[(ulong)UVar33 + 0x34] = sVar10 + uVar5;
            local_b0 = local_ac;
            local_b4 = UVar32;
          }
        }
        UVar33 = (uint)(6 < UVar33) * 3 + 8;
        puVar29 = pCVar7 + -0x500;
        local_ac = uVar22;
      }
      uVar5 = *puVar29;
      if (uVar26 < 0x1000000) {
        uVar26 = uVar26 << 8;
        bVar20 = *pbVar34;
        pbVar34 = pbVar34 + 1;
        uVar21 = uVar21 << 8 | (uint)bVar20;
      }
      uVar25 = (uVar26 >> 0xb) * (uint)uVar5;
      uVar22 = uVar21 - uVar25;
      if (uVar21 < uVar25) {
        *puVar29 = (short)(0x800 - uVar5 >> 5) + uVar5;
        if (uVar25 < 0x1000000) {
          uVar25 = uVar25 * 0x100;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar21 = uVar21 << 8 | (uint)bVar20;
        }
        uVar5 = puVar29[(ulong)uVar15 + 1];
        uVar31 = (uVar25 >> 0xb) * (uint)uVar5;
        uVar12 = uVar21 - uVar31;
        if (uVar21 < uVar31) {
          sVar10 = (short)(0x800 - uVar5 >> 5);
          uVar25 = 2;
          uVar12 = uVar21;
        }
        else {
          uVar31 = uVar25 - uVar31;
          sVar10 = -(uVar5 >> 5);
          uVar25 = 3;
        }
        puVar29[(ulong)uVar15 + 1] = sVar10 + uVar5;
        if (uVar31 < 0x1000000) {
          uVar31 = uVar31 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar12 = uVar12 << 8 | (uint)bVar20;
        }
        uVar5 = puVar29[(ulong)uVar15 + (ulong)uVar25];
        uVar26 = (uVar31 >> 0xb) * (uint)uVar5;
        uVar22 = uVar25 * 2;
        uVar21 = uVar12 - uVar26;
        if (uVar12 < uVar26) {
          puVar29[(ulong)uVar15 + (ulong)uVar25] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar21 = uVar12;
        }
        else {
          uVar26 = uVar31 - uVar26;
          puVar29[(ulong)uVar15 + (ulong)uVar25] = uVar5 - (uVar5 >> 5);
          uVar22 = uVar22 | 1;
        }
        uVar5 = puVar29[(ulong)uVar15 + (ulong)uVar22];
        if (uVar26 < 0x1000000) {
          uVar26 = uVar26 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar21 = uVar21 << 8 | (uint)bVar20;
        }
        uVar25 = (uVar26 >> 0xb) * (uint)uVar5;
        uVar31 = uVar22 * 2;
        uVar12 = uVar21 - uVar25;
        if (uVar21 < uVar25) {
          puVar29[(ulong)uVar15 + (ulong)uVar22] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar12 = uVar21;
        }
        else {
          uVar25 = uVar26 - uVar25;
          puVar29[(ulong)uVar15 + (ulong)uVar22] = uVar5 - (uVar5 >> 5);
          uVar31 = uVar31 | 1;
        }
        uVar31 = uVar31 - 8;
      }
      else {
        uVar26 = uVar26 - uVar25;
        *puVar29 = uVar5 - (uVar5 >> 5);
        if (uVar26 < 0x1000000) {
          uVar26 = uVar26 * 0x100;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar22 = uVar22 * 0x100 | (uint)bVar20;
        }
        uVar5 = puVar29[8];
        uVar25 = (uVar26 >> 0xb) * (uint)uVar5;
        uVar12 = uVar22 - uVar25;
        if (uVar22 < uVar25) {
          puVar29[8] = (short)(0x800 - uVar5 >> 5) + uVar5;
          if (uVar25 < 0x1000000) {
            uVar25 = uVar25 * 0x100;
            bVar20 = *pbVar34;
            pbVar34 = pbVar34 + 1;
            uVar22 = uVar22 << 8 | (uint)bVar20;
          }
          uVar5 = puVar29[(ulong)uVar15 + 9];
          uVar21 = (uVar25 >> 0xb) * (uint)uVar5;
          uVar12 = uVar22 - uVar21;
          if (uVar22 < uVar21) {
            sVar10 = (short)(0x800 - uVar5 >> 5);
            uVar31 = 2;
            uVar12 = uVar22;
          }
          else {
            uVar21 = uVar25 - uVar21;
            sVar10 = -(uVar5 >> 5);
            uVar31 = 3;
          }
          puVar29[(ulong)uVar15 + 9] = sVar10 + uVar5;
          if (uVar21 < 0x1000000) {
            uVar21 = uVar21 << 8;
            bVar20 = *pbVar34;
            pbVar34 = pbVar34 + 1;
            uVar12 = uVar12 << 8 | (uint)bVar20;
          }
          uVar23 = (ulong)uVar31;
          uVar5 = puVar29[(ulong)uVar15 + uVar23 + 8];
          uVar26 = (uVar21 >> 0xb) * (uint)uVar5;
          uVar31 = uVar31 * 2;
          uVar22 = uVar12 - uVar26;
          if (uVar12 < uVar26) {
            puVar29[(ulong)uVar15 + uVar23 + 8] = (short)(0x800 - uVar5 >> 5) + uVar5;
            uVar22 = uVar12;
          }
          else {
            uVar26 = uVar21 - uVar26;
            puVar29[(ulong)uVar15 + uVar23 + 8] = uVar5 - (uVar5 >> 5);
            uVar31 = uVar31 | 1;
          }
          uVar23 = (ulong)uVar31;
          uVar5 = puVar29[(ulong)uVar15 + uVar23 + 8];
          if (uVar26 < 0x1000000) {
            uVar26 = uVar26 << 8;
            bVar20 = *pbVar34;
            pbVar34 = pbVar34 + 1;
            uVar22 = (uint)bVar20 | uVar22 << 8;
          }
          uVar25 = (uVar26 >> 0xb) * (uint)uVar5;
          uVar31 = uVar31 * 2;
          uVar12 = uVar22 - uVar25;
          if (uVar22 < uVar25) {
            puVar29[(ulong)uVar15 + uVar23 + 8] = (short)(0x800 - uVar5 >> 5) + uVar5;
            uVar12 = uVar22;
          }
          else {
            uVar25 = uVar26 - uVar25;
            puVar29[(ulong)uVar15 + uVar23 + 8] = uVar5 - (uVar5 >> 5);
            uVar31 = uVar31 | 1;
          }
        }
        else {
          uVar25 = uVar26 - uVar25;
          puVar29[8] = uVar5 - (uVar5 >> 5);
          uVar23 = 1;
          do {
            uVar22 = uVar25;
            uVar21 = uVar12;
            if (uVar25 < 0x1000000) {
              uVar22 = uVar25 << 8;
              bVar20 = *pbVar34;
              pbVar34 = pbVar34 + 1;
              uVar21 = uVar12 << 8 | (uint)bVar20;
            }
            uVar5 = puVar29[uVar23 + 0x100];
            uVar25 = (uVar22 >> 0xb) * (uint)uVar5;
            uVar31 = (int)uVar23 * 2;
            uVar12 = uVar21 - uVar25;
            if (uVar21 < uVar25) {
              puVar29[uVar23 + 0x100] = (short)(0x800 - uVar5 >> 5) + uVar5;
              uVar12 = uVar21;
            }
            else {
              uVar25 = uVar22 - uVar25;
              puVar29[uVar23 + 0x100] = uVar5 - (uVar5 >> 5);
              uVar31 = uVar31 | 1;
            }
            uVar23 = (ulong)uVar31;
          } while (uVar31 < 0x100);
          uVar31 = uVar31 - 0xf0;
        }
      }
      if (0xb < UVar33) {
        uVar22 = 3;
        if (uVar31 < 3) {
          uVar22 = uVar31;
        }
        if (uVar25 < 0x1000000) {
          uVar25 = uVar25 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar12 = (uint)bVar20 | uVar12 << 8;
        }
        uVar23 = (ulong)(uVar22 << 7);
        uVar5 = *(ushort *)((long)pCVar7 + uVar23 + 0x82);
        uVar21 = (uVar25 >> 0xb) * (uint)uVar5;
        uVar22 = uVar12 - uVar21;
        if (uVar12 < uVar21) {
          sVar10 = (short)(0x800 - uVar5 >> 5);
          uVar15 = 2;
          uVar22 = uVar12;
        }
        else {
          uVar21 = uVar25 - uVar21;
          sVar10 = -(uVar5 >> 5);
          uVar15 = 3;
        }
        lVar11 = uVar23 + 0x80;
        *(ushort *)((long)pCVar7 + uVar23 + 0x82) = sVar10 + uVar5;
        if (uVar21 < 0x1000000) {
          uVar21 = uVar21 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar22 = (uint)bVar20 | uVar22 << 8;
        }
        uVar23 = (ulong)uVar15;
        uVar5 = *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11);
        uVar12 = (uVar21 >> 0xb) * (uint)uVar5;
        uVar15 = uVar15 * 2;
        uVar25 = uVar22 - uVar12;
        if (uVar22 < uVar12) {
          *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11) = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar25 = uVar22;
        }
        else {
          uVar12 = uVar21 - uVar12;
          *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11) = uVar5 - (uVar5 >> 5);
          uVar15 = uVar15 | 1;
        }
        uVar23 = (ulong)uVar15;
        uVar5 = *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11);
        if (uVar12 < 0x1000000) {
          uVar12 = uVar12 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar25 = (uint)bVar20 | uVar25 << 8;
        }
        uVar21 = (uVar12 >> 0xb) * (uint)uVar5;
        uVar15 = uVar15 * 2;
        uVar22 = uVar25 - uVar21;
        if (uVar25 < uVar21) {
          *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11) = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar22 = uVar25;
        }
        else {
          uVar21 = uVar12 - uVar21;
          *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11) = uVar5 - (uVar5 >> 5);
          uVar15 = uVar15 | 1;
        }
        uVar23 = (ulong)uVar15;
        uVar5 = *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11);
        if (uVar21 < 0x1000000) {
          uVar21 = uVar21 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar22 = (uint)bVar20 | uVar22 << 8;
        }
        uVar12 = (uVar21 >> 0xb) * (uint)uVar5;
        uVar15 = uVar15 * 2;
        uVar25 = uVar22 - uVar12;
        if (uVar22 < uVar12) {
          *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11) = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar25 = uVar22;
        }
        else {
          uVar12 = uVar21 - uVar12;
          *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11) = uVar5 - (uVar5 >> 5);
          uVar15 = uVar15 | 1;
        }
        uVar23 = (ulong)uVar15;
        uVar5 = *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11);
        if (uVar12 < 0x1000000) {
          uVar12 = uVar12 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar25 = (uint)bVar20 | uVar25 << 8;
        }
        uVar21 = (uVar12 >> 0xb) * (uint)uVar5;
        uVar15 = uVar15 * 2;
        uVar22 = uVar25 - uVar21;
        if (uVar25 < uVar21) {
          *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11) = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar22 = uVar25;
        }
        else {
          uVar21 = uVar12 - uVar21;
          *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11) = uVar5 - (uVar5 >> 5);
          uVar15 = uVar15 | 1;
        }
        uVar23 = (ulong)uVar15;
        uVar5 = *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11);
        if (uVar21 < 0x1000000) {
          uVar21 = uVar21 << 8;
          bVar20 = *pbVar34;
          pbVar34 = pbVar34 + 1;
          uVar22 = (uint)bVar20 | uVar22 << 8;
        }
        uVar25 = (uVar21 >> 0xb) * (uint)uVar5;
        uVar15 = uVar15 * 2;
        uVar12 = uVar22 - uVar25;
        if (uVar22 < uVar25) {
          *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11) = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar12 = uVar22;
        }
        else {
          uVar25 = uVar21 - uVar25;
          *(ushort *)((long)pCVar7 + uVar23 * 2 + lVar11) = uVar5 - (uVar5 >> 5);
          uVar15 = uVar15 | 1;
        }
        uVar22 = uVar15 - 0x40;
        if (uVar22 < 4) {
LAB_00132baf:
          local_94 = local_b0;
          local_b0 = local_ac;
          local_ac = local_b4;
          local_b4 = uVar22 + 1;
          uVar21 = uVar6;
          if (uVar6 == 0) {
            uVar21 = local_a4;
          }
          uVar15 = uVar31 + 0x202;
          if (uVar21 > uVar22) {
            uVar15 = uVar31;
          }
          uVar31 = uVar15;
          UVar33 = (uint)(0x12 < UVar33) * 3 + 7;
          cVar14 = (uVar21 <= uVar22) * '\x02';
        }
        else {
          uVar21 = uVar15 & 1 | 2;
          if (uVar22 < 0xe) {
            iVar16 = (uVar22 >> 1) - 1;
            uVar22 = (uVar21 << ((byte)iVar16 & 0x1f)) + 1;
            iVar17 = 1;
            do {
              iVar28 = iVar17;
              if (uVar25 < 0x1000000) {
                uVar25 = uVar25 << 8;
                bVar20 = *pbVar34;
                pbVar34 = pbVar34 + 1;
                uVar12 = uVar12 << 8 | (uint)bVar20;
              }
              uVar5 = pCVar7[(ulong)uVar22 - 0x680];
              uVar21 = (uVar25 >> 0xb) * (uint)uVar5;
              if (uVar12 < uVar21) {
                sVar10 = (short)(0x800 - uVar5 >> 5);
                uVar25 = uVar21;
                iVar17 = iVar28;
              }
              else {
                uVar25 = uVar25 - uVar21;
                sVar10 = -(uVar5 >> 5);
                uVar12 = uVar12 - uVar21;
                iVar17 = iVar28 * 2;
              }
              pCVar7[(ulong)uVar22 - 0x680] = sVar10 + uVar5;
              uVar22 = uVar22 + iVar17;
              iVar16 = iVar16 + -1;
              iVar17 = iVar28 * 2;
            } while (iVar16 != 0);
            uVar22 = uVar22 + iVar28 * -2;
            cVar14 = '\0';
            bVar37 = true;
          }
          else {
            iVar17 = (uVar22 >> 1) - 5;
            do {
              uVar22 = uVar25;
              if (uVar25 < 0x1000000) {
                bVar20 = *pbVar34;
                pbVar34 = pbVar34 + 1;
                uVar12 = (uint)bVar20 | uVar12 << 8;
                uVar22 = uVar25 << 8;
              }
              uVar25 = uVar22 >> 1;
              uVar15 = (int)(uVar12 - uVar25) >> 0x1f;
              uVar21 = uVar15 + uVar21 * 2 + 1;
              uVar12 = (uVar15 & uVar25) + (uVar12 - uVar25);
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
            if (uVar22 < 0x2000000) {
              uVar25 = uVar25 << 8;
              bVar20 = *pbVar34;
              pbVar34 = pbVar34 + 1;
              uVar12 = (uint)bVar20 | uVar12 * 0x100;
            }
            uVar5 = pCVar7[1];
            uVar26 = (uVar25 >> 0xb) * (uint)uVar5;
            uVar15 = uVar12 - uVar26;
            if (uVar12 < uVar26) {
              sVar10 = (short)(0x800 - uVar5 >> 5);
              uVar22 = 2;
              uVar15 = uVar12;
            }
            else {
              uVar26 = uVar25 - uVar26;
              sVar10 = -(uVar5 >> 5);
              uVar22 = 3;
            }
            pCVar7[1] = sVar10 + uVar5;
            if (uVar26 < 0x1000000) {
              uVar26 = uVar26 << 8;
              bVar20 = *pbVar34;
              pbVar34 = pbVar34 + 1;
              uVar15 = (uint)bVar20 | uVar15 << 8;
            }
            uVar5 = pCVar7[uVar22];
            uVar12 = (uVar26 >> 0xb) * (uint)uVar5;
            uVar25 = uVar15 - uVar12;
            if (uVar15 < uVar12) {
              pCVar7[uVar22] = (short)(0x800 - uVar5 >> 5) + uVar5;
              uVar22 = uVar22 + 2;
              uVar25 = uVar15;
            }
            else {
              uVar12 = uVar26 - uVar12;
              pCVar7[uVar22] = uVar5 - (uVar5 >> 5);
              uVar22 = uVar22 + 4;
            }
            uVar5 = pCVar7[uVar22];
            if (uVar12 < 0x1000000) {
              uVar12 = uVar12 << 8;
              bVar20 = *pbVar34;
              pbVar34 = pbVar34 + 1;
              uVar25 = (uint)bVar20 | uVar25 << 8;
            }
            uVar26 = (uVar12 >> 0xb) * (uint)uVar5;
            uVar15 = uVar25 - uVar26;
            if (uVar25 < uVar26) {
              sVar10 = (short)(0x800 - uVar5 >> 5);
              iVar17 = 4;
              uVar15 = uVar25;
            }
            else {
              uVar26 = uVar12 - uVar26;
              sVar10 = -(uVar5 >> 5);
              iVar17 = 8;
            }
            pCVar7[uVar22] = sVar10 + uVar5;
            uVar22 = iVar17 + uVar22;
            uVar5 = pCVar7[uVar22];
            if (uVar26 < 0x1000000) {
              uVar26 = uVar26 << 8;
              bVar20 = *pbVar34;
              pbVar34 = pbVar34 + 1;
              uVar15 = (uint)bVar20 | uVar15 << 8;
            }
            uVar25 = (uVar26 >> 0xb) * (uint)uVar5;
            uVar12 = uVar15 - uVar25;
            if (uVar15 < uVar25) {
              pCVar7[uVar22] = (short)(0x800 - uVar5 >> 5) + uVar5;
              uVar22 = uVar22 - 8;
              uVar12 = uVar15;
            }
            else {
              uVar25 = uVar26 - uVar25;
              pCVar7[uVar22] = uVar5 - (uVar5 >> 5);
            }
            uVar22 = uVar21 * 0x10 | uVar22;
            if (uVar22 == 0xffffffff) {
              UVar33 = UVar33 - 0xc;
              uVar22 = 0xffffffff;
              cVar14 = '\x02';
              uVar31 = 0x112;
              bVar37 = false;
            }
            else {
              cVar14 = '\0';
              bVar37 = true;
            }
          }
          if (bVar37) goto LAB_00132baf;
        }
        if (cVar14 != '\0') goto LAB_00132c97;
      }
      uVar31 = uVar31 + 2;
      cVar14 = '\x02';
      uVar23 = limit - SVar36;
      if (uVar23 != 0) {
        uVar24 = uVar23 & 0xffffffff;
        if (uVar31 <= uVar23) {
          uVar24 = (ulong)uVar31;
        }
        SVar30 = 0;
        if (SVar36 < local_b4) {
          SVar30 = SVar9;
        }
        SVar30 = SVar30 + (SVar36 - local_b4);
        local_a4 = local_a4 + (int)uVar24;
        uVar31 = uVar31 - (int)uVar24;
        if (SVar9 - SVar30 < uVar24) {
          do {
            pBVar8[SVar36] = pBVar8[SVar30];
            SVar36 = SVar36 + 1;
            SVar30 = SVar30 + 1;
            cVar14 = '\0';
            if (SVar30 == SVar9) {
              SVar30 = 0;
            }
            uVar22 = (int)uVar24 - 1;
            uVar24 = (ulong)uVar22;
          } while (uVar22 != 0);
        }
        else {
          pBVar19 = pBVar8 + SVar36;
          uVar23 = uVar24;
          do {
            *pBVar19 = pBVar19[SVar30 - SVar36];
            pBVar19 = pBVar19 + 1;
            uVar23 = uVar23 - 1;
          } while (uVar23 != 0);
          SVar36 = SVar36 + uVar24;
          cVar14 = '\0';
        }
      }
    }
LAB_00132c97:
    if (((cVar14 == '\x02') || (limit <= SVar36)) || (bufLimit <= pbVar34)) {
      if (uVar25 < 0x1000000) {
        uVar25 = uVar25 << 8;
        bVar1 = *pbVar34;
        pbVar34 = pbVar34 + 1;
        uVar12 = (uint)bVar1 | uVar12 << 8;
      }
      p->buf = pbVar34;
      p->range = uVar25;
      p->code = uVar12;
      p->remainLen = uVar31;
      p->dicPos = SVar36;
      p->processedPos = local_a4;
      p->reps[0] = local_b4;
      p->reps[1] = local_ac;
      p->reps[2] = local_b0;
      p->reps[3] = local_94;
      p->state = UVar33;
      if ((p->checkDicSize == 0) && (uVar6 = (p->prop).dicSize, uVar6 <= local_a4)) {
        p->checkDicSize = uVar6;
      }
      return (uint)(0x1ff < uVar31);
    }
  } while( true );
}

Assistant:

static int Z7_FASTCALL LzmaDec_DecodeReal2(CLzmaDec *p, SizeT limit, const Byte *bufLimit)
{
  if (p->checkDicSize == 0)
  {
    UInt32 rem = p->prop.dicSize - p->processedPos;
    if (limit - p->dicPos > rem)
      limit = p->dicPos + rem;
  }
  {
    int res = LZMA_DECODE_REAL(p, limit, bufLimit);
    if (p->checkDicSize == 0 && p->processedPos >= p->prop.dicSize)
      p->checkDicSize = p->prop.dicSize;
    return res;
  }
}